

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int TestRegNumEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86Reg_int *fun,bool onlySmall)

{
  x86Reg reg1;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  int local_48;
  
  lVar3 = 0;
  puVar2 = stream;
  do {
    reg1 = *(x86Reg *)((long)testRegs + lVar3);
    EMIT_OP_REG_NUM(ctx,op,reg1,4);
    iVar1 = (*fun)(puVar2,reg1,4);
    puVar2 = puVar2 + iVar1;
    if (!onlySmall) {
      EMIT_OP_REG_NUM(ctx,op,reg1,0x400);
      iVar1 = (*fun)(puVar2,reg1,0x400);
      puVar2 = puVar2 + iVar1;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x24);
  local_48 = (int)stream;
  return (int)puVar2 - local_48;
}

Assistant:

int TestRegNumEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, int num), bool onlySmall = false)
{
	unsigned char *start = stream;

	for(unsigned reg = 0; reg < sizeof(testRegs) / sizeof(testRegs[0]); reg++)
	{
		EMIT_OP_REG_NUM(ctx, op, testRegs[reg], 4);
		stream += fun(stream, testRegs[reg], 4);

		if(!onlySmall)
		{
			EMIT_OP_REG_NUM(ctx, op, testRegs[reg], 1024);
			stream += fun(stream, testRegs[reg], 1024);
		}
	}

	return int(stream - start);
}